

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O0

void check(wasm_ref_t *actual,wasm_ref_t *expected)

{
  ulong uVar1;
  undefined8 local_30;
  undefined8 local_20;
  wasm_ref_t *expected_local;
  wasm_ref_t *actual_local;
  
  if (actual != expected) {
    if ((actual != (wasm_ref_t *)0x0) && (expected != (wasm_ref_t *)0x0)) {
      uVar1 = wasm_ref_same(actual,expected);
      if ((uVar1 & 1) != 0) goto LAB_00102a01;
    }
    if (expected == (wasm_ref_t *)0x0) {
      local_20 = 0;
    }
    else {
      local_20 = wasm_ref_get_host_info(expected);
    }
    if (actual == (wasm_ref_t *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = wasm_ref_get_host_info(actual);
    }
    printf("> Error reading reference, expected %p, got %p\n",local_20,local_30);
    exit(1);
  }
LAB_00102a01:
  if (actual != (wasm_ref_t *)0x0) {
    wasm_ref_delete(actual);
  }
  return;
}

Assistant:

void check(own wasm_ref_t* actual, const wasm_ref_t* expected) {
  if (actual != expected &&
      !(actual && expected && wasm_ref_same(actual, expected))) {
    printf("> Error reading reference, expected %p, got %p\n",
      expected ? wasm_ref_get_host_info(expected) : NULL,
      actual ? wasm_ref_get_host_info(actual) : NULL);
    exit(1);
  }
  if (actual) wasm_ref_delete(actual);
}